

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::normal_dist<float>::cdf(normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  result_type_conflict1 rVar2;
  
  fVar1 = ((x - (this->P).mu_) / (this->P).sigma_) * 0.70710677;
  if (-0.47693625 <= fVar1) {
    if (fVar1 <= 0.47693625) {
      fVar1 = erff(fVar1);
      rVar2 = fVar1 * 0.5 + 0.5;
    }
    else {
      fVar1 = erfcf(fVar1);
      rVar2 = fVar1 * -0.5 + 1.0;
    }
  }
  else {
    fVar1 = erfcf(-fVar1);
    rVar2 = fVar1 * 0.5;
  }
  return rVar2;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }